

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QList<QCss::StyleRule> * __thiscall
QStyleSheetStyle::styleRules
          (QList<QCss::StyleRule> *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj)

{
  Span *pSVar1;
  Span *pSVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  char cVar6;
  Data *signal;
  QObject *obj_00;
  QDebug *pQVar7;
  pointer pSVar8;
  ulong uVar9;
  QHash<const_void_*,_QCss::StyleSheet> *this_00;
  int iVar10;
  CaseSensitivity CVar11;
  QStyleSheetStyle *this_01;
  int iVar12;
  long lVar13;
  int i;
  StyleSheet *pSVar14;
  undefined1 *puVar15;
  long in_FS_OFFSET;
  const_iterator cVar16;
  const_iterator cVar17;
  QDebug local_250;
  undefined1 local_248 [8];
  QArrayDataPointer<char16_t> local_240;
  QArrayDataPointer<char16_t> local_228;
  QArrayDataPointer<QCss::StyleSheet> local_208;
  Object local_1f0 [8];
  StyleSheet local_1e8;
  undefined **local_148;
  QList<QCss::StyleSheet> local_140;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  QHash<const_QObject_*,_QHash<QString,_QString>_> local_108;
  QObject *obj_local;
  undefined1 local_f8 [32];
  StyleSheet local_d8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QStyleSheetStyle *)&styleSheetCaches->styleRulesCache;
  obj_local = obj;
  cVar16 = QHash<QObject_const*,QList<QCss::StyleRule>>::constFindImpl<QObject_const*>
                     ((QHash<QObject_const*,QList<QCss::StyleRule>> *)this_01,&obj_local);
  if (cVar16.i.d == (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0 &&
      cVar16.i.bucket == 0) {
    bVar5 = initObject(this_01,obj_local);
    if (bVar5) {
      local_140.d.d = (Data *)0x0;
      local_140.d.ptr = (StyleSheet *)0x0;
      local_140.d.size = 0;
      uStack_128 = 0;
      local_120 = 0;
      uStack_118 = 0;
      local_110 = 0xaaaaaaaa00000001;
      local_148 = &PTR__QStyleSheetStyleSelector_007c40d0;
      local_108.d = (Data *)0x0;
      memset(&local_1e8,0,0xa0);
      this_00 = &styleSheetCaches->styleSheetCache;
      local_d8.styleRules.d.d = (Data *)baseStyle(this);
      cVar17 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                         ((QHash<void_const*,QCss::StyleSheet> *)this_00,(void **)&local_d8);
      if (cVar17.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
          cVar17.i.bucket == 0) {
        getDefaultStyleSheet(&local_d8,this);
        QCss::StyleSheet::operator=(&local_1e8,&local_d8);
        QCss::StyleSheet::~StyleSheet(&local_d8);
        signal = (Data *)baseStyle(this);
        local_d8.styleRules.d.d = signal;
        QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                  ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,
                   (void **)&local_d8,&local_1e8);
        local_d8.styleRules.d.d = (Data *)QStyleSheetStyleCaches::styleDestroyed;
        local_d8.styleRules.d.ptr = (StyleRule *)0x0;
        QObject::connect<void(QObject::*)(QObject*),void(QStyleSheetStyleCaches::*)(QObject*)>
                  (local_1f0,(offset_in_QObject_to_subr)signal,(ContextType *)QObject::destroyed,
                   (offset_in_QStyleSheetStyleCaches_to_subr *)0x0,(ConnectionType)styleSheetCaches)
        ;
        QMetaObject::Connection::~Connection((Connection *)local_1f0);
      }
      else {
        pSVar2 = (cVar17.i.d)->spans;
        uVar9 = cVar17.i.bucket >> 7;
        QCss::StyleSheet::operator=
                  (&local_1e8,
                   (StyleSheet *)
                   (pSVar2[uVar9].entries[pSVar2[uVar9].offsets[(uint)cVar17.i.bucket & 0x7f]].
                    storage.data + 8));
      }
      QList<QCss::StyleSheet>::emplaceBack<QCss::StyleSheet_const&>(&local_140,&local_1e8);
      QApplication::styleSheet((QString *)&local_d8,QCoreApplication::self);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
      if (local_d8.styleRules.d.size != 0) {
        memset(&local_d8,0,0xa0);
        local_f8._0_4_ = SUB84(QCoreApplication::self,0);
        local_f8._4_4_ = (undefined4)((ulong)QCoreApplication::self >> 0x20);
        cVar17 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                           ((QHash<void_const*,QCss::StyleSheet> *)
                            &styleSheetCaches->styleSheetCache,(void **)local_f8);
        if (cVar17.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
            cVar17.i.bucket == 0) {
          local_208.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_208.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_208.ptr = (StyleSheet *)&DAT_aaaaaaaaaaaaaaaa;
          QApplication::styleSheet((QString *)&local_208,QCoreApplication::self);
          cVar6 = QString::startsWith((QLatin1String *)&local_208,8);
          if (cVar6 != '\0') {
            QString::remove((longlong)&local_208,0);
          }
          QApplication::styleSheet((QString *)local_f8,QCoreApplication::self);
          ::operator!=((QString *)local_f8,(QString *)&local_208);
          QCss::Parser::init((QString *)(this + 0x20),SUB81(&local_208,0));
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
          cVar6 = QCss::Parser::parse((StyleSheet *)(this + 0x20),(CaseSensitivity)&local_d8);
          if (cVar6 == '\0') {
            local_f8._0_4_ = 2;
            local_f8._20_4_ = 0;
            local_f8._4_4_ = 0;
            local_f8._8_4_ = 0;
            local_f8._12_4_ = 0;
            local_f8._16_4_ = 0;
            local_f8._24_8_ = "default";
            QMessageLogger::warning(local_f8,"Could not parse application stylesheet");
          }
          local_d8.origin = StyleSheetOrigin_Inline;
          local_d8.depth = 1;
          local_f8._0_4_ = SUB84(QCoreApplication::self,0);
          local_f8._4_4_ = (undefined4)((ulong)QCoreApplication::self >> 0x20);
          QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                    ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,
                     (void **)local_f8,&local_d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208)
          ;
        }
        else {
          pSVar2 = (cVar17.i.d)->spans;
          uVar9 = cVar17.i.bucket >> 7;
          QCss::StyleSheet::operator=
                    (&local_d8,
                     (StyleSheet *)
                     (pSVar2[uVar9].entries[pSVar2[uVar9].offsets[(uint)cVar17.i.bucket & 0x7f]].
                      storage.data + 8));
        }
        QList<QCss::StyleSheet>::emplaceBack<QCss::StyleSheet_const&>(&local_140,&local_d8);
        QCss::StyleSheet::~StyleSheet(&local_d8);
      }
      local_208.size = 0;
      local_208.d = (Data *)0x0;
      local_208.ptr = (StyleSheet *)0x0;
      pSVar14 = (StyleSheet *)(this + 0x20);
      obj_00 = obj_local;
      while (obj_00 != (QObject *)0x0) {
        local_228.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_228.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_228.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QObject::property((char *)&local_d8);
        ::QVariant::toString();
        ::QVariant::~QVariant((QVariant *)&local_d8);
        if ((undefined1 *)local_228.size != (undefined1 *)0x0) {
          memset(&local_d8,0,0xa0);
          local_f8._0_4_ = SUB84(obj_00,0);
          uVar3 = local_f8._0_4_;
          local_f8._4_4_ = (undefined4)((ulong)obj_00 >> 0x20);
          uVar4 = local_f8._4_4_;
          cVar17 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                             ((QHash<void_const*,QCss::StyleSheet> *)
                              &styleSheetCaches->styleSheetCache,(void **)local_f8);
          if (cVar17.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
              cVar17.i.bucket == 0) {
            QCss::Parser::init((QString *)pSVar14,SUB81(&local_228,0));
            CVar11 = (CaseSensitivity)&local_d8;
            cVar6 = QCss::Parser::parse(pSVar14,CVar11);
            if (cVar6 == '\0') {
              local_f8._0_4_ = 3;
              local_f8._4_4_ = 0;
              local_f8._8_4_ = 0x5f61ef;
              local_f8._12_4_ = 0;
              local_f8._24_2_ = 0x7d;
              local_f8._16_8_ = &local_228;
              QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t>::convertTo<QString>
                        ((QString *)&local_240,
                         (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t> *)
                         local_f8);
              QCss::Parser::init((QString *)pSVar14,SUB81(&local_240,0));
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240);
              cVar6 = QCss::Parser::parse(pSVar14,CVar11);
              if (cVar6 == '\0') {
                local_f8._0_4_ = 2;
                local_f8._4_4_ = 0;
                local_f8._8_4_ = 0;
                local_f8._12_4_ = 0;
                local_f8._16_4_ = 0;
                local_f8._20_4_ = 0;
                local_f8._24_8_ = "default";
                QMessageLogger::warning();
                pQVar7 = QDebug::operator<<((QDebug *)&local_240,
                                            "Could not parse stylesheet of object");
                local_250.stream = pQVar7->stream;
                *(int *)(local_250.stream + 0x28) = *(int *)(local_250.stream + 0x28) + 1;
                ::operator<<((Stream *)local_248,(QObject *)&local_250);
                QDebug::~QDebug((QDebug *)local_248);
                QDebug::~QDebug(&local_250);
                QDebug::~QDebug((QDebug *)&local_240);
              }
            }
            local_d8.origin = StyleSheetOrigin_Inline;
            local_f8._0_4_ = uVar3;
            local_f8._4_4_ = uVar4;
            QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                      ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,
                       (void **)local_f8,&local_d8);
          }
          else {
            pSVar2 = (cVar17.i.d)->spans;
            uVar9 = cVar17.i.bucket >> 7;
            QCss::StyleSheet::operator=
                      (&local_d8,
                       (StyleSheet *)
                       (pSVar2[uVar9].entries[pSVar2[uVar9].offsets[(uint)cVar17.i.bucket & 0x7f]].
                        storage.data + 8));
          }
          QList<QCss::StyleSheet>::emplaceBack<QCss::StyleSheet_const&>
                    ((QList<QCss::StyleSheet> *)&local_208,&local_d8);
          QCss::StyleSheet::~StyleSheet(&local_d8);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
        obj_00 = parentObject(obj_00);
      }
      iVar10 = 2;
      lVar13 = 0x7c;
      for (puVar15 = (undefined1 *)0x0; puVar15 < (ulong)local_208.size; puVar15 = puVar15 + 1) {
        iVar12 = (int)local_208.size;
        pSVar8 = QList<QCss::StyleSheet>::data((QList<QCss::StyleSheet> *)&local_208);
        *(int *)((long)&(pSVar8->styleRules).d.d + lVar13) = iVar12 + iVar10;
        iVar10 = iVar10 + -1;
        lVar13 = lVar13 + 0xa0;
      }
      QList<QCss::StyleSheet>::append(&local_140,(QList<QCss::StyleSheet> *)&local_208);
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
      QCss::StyleSelector::styleRulesForNode((NodePtr)__return_storage_ptr__);
      QHash<QObject_const*,QList<QCss::StyleRule>>::emplace<QList<QCss::StyleRule>const&>
                ((QHash<QObject_const*,QList<QCss::StyleRule>> *)&styleSheetCaches->styleRulesCache,
                 &obj_local,__return_storage_ptr__);
      QArrayDataPointer<QCss::StyleSheet>::~QArrayDataPointer(&local_208);
      QCss::StyleSheet::~StyleSheet(&local_1e8);
      QStyleSheetStyleSelector::~QStyleSheetStyleSelector((QStyleSheetStyleSelector *)&local_148);
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (StyleRule *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
  }
  else {
    pSVar1 = (cVar16.i.d)->spans;
    uVar9 = cVar16.i.bucket >> 7;
    QArrayDataPointer<QCss::StyleRule>::QArrayDataPointer
              (&__return_storage_ptr__->d,
               (QArrayDataPointer<QCss::StyleRule> *)
               (pSVar1[uVar9].entries[pSVar1[uVar9].offsets[(uint)cVar16.i.bucket & 0x7f]].storage.
                data + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QCss::StyleRule> QStyleSheetStyle::styleRules(const QObject *obj) const
{
    QHash<const QObject *, QList<StyleRule>>::const_iterator cacheIt =
            styleSheetCaches->styleRulesCache.constFind(obj);
    if (cacheIt != styleSheetCaches->styleRulesCache.constEnd())
        return cacheIt.value();

    if (!initObject(obj)) {
        return QList<StyleRule>();
    }

    QStyleSheetStyleSelector styleSelector;

    StyleSheet defaultSs;
    QHash<const void *, StyleSheet>::const_iterator defaultCacheIt = styleSheetCaches->styleSheetCache.constFind(baseStyle());
    if (defaultCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
        defaultSs = getDefaultStyleSheet();
        QStyle *bs = baseStyle();
        styleSheetCaches->styleSheetCache.insert(bs, defaultSs);
        QObject::connect(bs, &QStyle::destroyed, styleSheetCaches,
                         &QStyleSheetStyleCaches::styleDestroyed);
    } else {
        defaultSs = defaultCacheIt.value();
    }
    styleSelector.styleSheets += defaultSs;

    if (!qApp->styleSheet().isEmpty()) {
        StyleSheet appSs;
        QHash<const void *, StyleSheet>::const_iterator appCacheIt = styleSheetCaches->styleSheetCache.constFind(qApp);
        if (appCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            QString ss = qApp->styleSheet();
            if (ss.startsWith("file:///"_L1))
                ss.remove(0, 8);
            parser.init(ss, qApp->styleSheet() != ss);
            if (Q_UNLIKELY(!parser.parse(&appSs)))
                qWarning("Could not parse application stylesheet");
            appSs.origin = StyleSheetOrigin_Inline;
            appSs.depth = 1;
            styleSheetCaches->styleSheetCache.insert(qApp, appSs);
        } else {
            appSs = appCacheIt.value();
        }
        styleSelector.styleSheets += appSs;
    }

    QList<QCss::StyleSheet> objectSs;
    for (const QObject *o = obj; o; o = parentObject(o)) {
        QString styleSheet = o->property("styleSheet").toString();
        if (styleSheet.isEmpty())
            continue;
        StyleSheet ss;
        QHash<const void *, StyleSheet>::const_iterator objCacheIt = styleSheetCaches->styleSheetCache.constFind(o);
        if (objCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            parser.init(styleSheet);
            if (!parser.parse(&ss)) {
                parser.init("* {"_L1 + styleSheet + u'}');
                if (Q_UNLIKELY(!parser.parse(&ss)))
                   qWarning() << "Could not parse stylesheet of object" << o;
            }
            ss.origin = StyleSheetOrigin_Inline;
            styleSheetCaches->styleSheetCache.insert(o, ss);
        } else {
            ss = objCacheIt.value();
        }
        objectSs.append(ss);
    }

    for (int i = 0; i < objectSs.size(); i++)
        objectSs[i].depth = objectSs.size() - i + 2;

    styleSelector.styleSheets += objectSs;

    StyleSelector::NodePtr n;
    n.ptr = const_cast<QObject *>(obj);
    QList<QCss::StyleRule> rules = styleSelector.styleRulesForNode(n);
    styleSheetCaches->styleRulesCache.insert(obj, rules);
    return rules;
}